

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O3

bool medit_affect(CHAR_DATA *ch,char *argument)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  if (*argument != '\0') {
    pvVar1 = ch->desc->pEdit;
    iVar2 = flag_value(affect_flags,argument);
    if (iVar2 != -99) {
      iVar3 = iVar2 + 0x1f;
      if (-1 < iVar2) {
        iVar3 = iVar2;
      }
      lVar5 = (long)(iVar3 >> 5);
      uVar4 = *(ulong *)((long)pvVar1 + lVar5 * 8 + 0x88);
      dVar6 = ldexp(1.0,iVar2 % 0x20);
      dVar7 = ldexp(1.0,iVar2 % 0x20);
      if ((uVar4 & (long)dVar6) == 0) {
        uVar4 = (long)dVar7 | *(ulong *)((long)pvVar1 + lVar5 * 8 + 0x88);
      }
      else {
        uVar4 = ~(long)dVar7 & *(ulong *)((long)pvVar1 + lVar5 * 8 + 0x88);
      }
      *(ulong *)((long)pvVar1 + lVar5 * 8 + 0x88) = uVar4;
      send_to_char("Affect flag toggled.\n\r",ch);
      return true;
    }
  }
  send_to_char("Syntax: affect [flag]\n\rType \'? affect\' for a list of flags.\n\r",ch);
  return false;
}

Assistant:

bool medit_affect(CHAR_DATA *ch, char *argument) /* Moved out of medit() due to naming conflicts -- Hugin */
{
	MOB_INDEX_DATA *pMob;
	int value;

	if (argument[0] != '\0')
	{
		EDIT_MOB(ch, pMob);

		value = flag_value(affect_flags, argument);
		if ((value) != NO_FLAG)
		{
			TOGGLE_BIT(pMob->affected_by, value);

			send_to_char("Affect flag toggled.\n\r", ch);
			return true;
		}
	}

	send_to_char("Syntax: affect [flag]\n\r"\
				 "Type '? affect' for a list of flags.\n\r", ch);
	return false;
}